

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testNetBios(void)

{
  char buffer2 [1024];
  size_t length;
  char buffer [1024];
  char *name;
  char acStackY_818 [8];
  size_t in_stack_fffffffffffff7f0;
  void *in_stack_fffffffffffff7f8;
  void *in_stack_fffffffffffff800;
  char local_408 [1024];
  char *local_8;
  
  local_8 = "*";
  __wrap_memcpy(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
  printf("%s\n");
  memset(acStackY_818,0,0x400);
  decodeNetBiosName(acStackY_818,local_408,0x20);
  printf("%s\n",acStackY_818);
  return;
}

Assistant:

void
testNetBios() {
	const char* name = "*";

	char buffer[1024] = "CKAAAAAAA" "AAAAAAAAAAAAAAAA" "AAAAAAA"; //{ 0 };
	size_t length = 32; //encodeNetBiosName (buffer, name);
	printf("%s\n", buffer);

	char buffer2[1024] = { 0 };
	decodeNetBiosName(buffer2, buffer, length);
	printf("%s\n", buffer2);
}